

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  LRUHandle **ppLVar1;
  char *__s1;
  size_t __n;
  int iVar2;
  LRUHandle *pLVar3;
  LRUHandle **ppLVar4;
  
  ppLVar4 = this->list_ + (this->length_ - 1 & hash);
  if (*ppLVar4 != (LRUHandle *)0x0) {
    __s1 = key->data_;
    __n = key->size_;
    pLVar3 = *ppLVar4;
    do {
      if (pLVar3->hash == hash) {
        if (pLVar3->next == pLVar3) {
          __assert_fail("next != this",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                        ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
        }
        if ((__n == pLVar3->key_length) && (iVar2 = bcmp(__s1,pLVar3->key_data,__n), iVar2 == 0)) {
          return ppLVar4;
        }
      }
      ppLVar1 = &pLVar3->next_hash;
      ppLVar4 = &pLVar3->next_hash;
      pLVar3 = *ppLVar1;
    } while (*ppLVar1 != (LRUHandle *)0x0);
  }
  return ppLVar4;
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }